

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Electromagnetic_Emission_PDU.cpp
# Opt level: O2

void __thiscall
KDIS::PDU::Electromagnetic_Emission_PDU::~Electromagnetic_Emission_PDU
          (Electromagnetic_Emission_PDU *this)

{
  ~Electromagnetic_Emission_PDU(this);
  operator_delete(this,0x68);
  return;
}

Assistant:

Electromagnetic_Emission_PDU::~Electromagnetic_Emission_PDU()
{
    m_vEmissionSystem.clear();
}